

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

void blend_color(size_t size,Span *array,void *userData)

{
  long lVar1;
  uint32_t *puVar2;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  Span *span;
  size_t i;
  uint32_t color;
  Operator op;
  VSpanData *data;
  VSpanData *in_stack_ffffffffffffff90;
  ulong uVar3;
  int in_stack_ffffffffffffff98;
  int x;
  VSpanData *in_stack_ffffffffffffffa0;
  undefined8 local_50;
  
  getOperator(in_stack_ffffffffffffff90);
  x = *(int *)(in_RDX + 0x48);
  for (uVar3 = 0; uVar3 < in_RDI; uVar3 = uVar3 + 1) {
    lVar1 = in_RSI + uVar3 * 8;
    puVar2 = VSpanData::buffer(in_stack_ffffffffffffffa0,x,in_stack_ffffffffffffff98);
    (*local_50)(puVar2,*(undefined2 *)(lVar1 + 4),x,*(undefined1 *)(lVar1 + 6));
  }
  return;
}

Assistant:

static void blend_color(size_t size, const VRle::Span *array, void *userData)
{
    VSpanData *data = (VSpanData *)(userData);
    Operator   op = getOperator(data);
    const uint32_t color = data->mSolid;

    for (size_t i = 0 ; i < size; ++i) {
        const auto &span = array[i];
        op.funcSolid(data->buffer(span.x, span.y), span.len, color, span.coverage);
    }
}